

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O1

Status __thiscall
google::protobuf::anon_unknown_21::ValidateMergedFeatures
          (anon_unknown_21 *this,FeatureSet *features)

{
  uint uVar1;
  char *args;
  
  if ((features->field_0)._impl_.field_presence_ - 4U < 0xfffffffd) {
    args = 
    "Feature field `field_presence` must resolve to a known value, found FIELD_PRESENCE_UNKNOWN";
  }
  else if ((features->field_0)._impl_.enum_type_ - 3U < 0xfffffffe) {
    args = "Feature field `enum_type` must resolve to a known value, found ENUM_TYPE_UNKNOWN";
  }
  else if ((features->field_0)._impl_.repeated_field_encoding_ - 3U < 0xfffffffe) {
    args = 
    "Feature field `repeated_field_encoding` must resolve to a known value, found REPEATED_FIELD_ENCODING_UNKNOWN"
    ;
  }
  else {
    uVar1 = (features->field_0)._impl_.utf8_validation_;
    if ((uVar1 - 4 < 0xfffffffd) || ((0xdU >> (uVar1 & 0x1f) & 1) == 0)) {
      args = 
      "Feature field `utf8_validation` must resolve to a known value, found UTF8_VALIDATION_UNKNOWN"
      ;
    }
    else if ((features->field_0)._impl_.message_encoding_ - 3U < 0xfffffffe) {
      args = 
      "Feature field `message_encoding` must resolve to a known value, found MESSAGE_ENCODING_UNKNOWN"
      ;
    }
    else if ((features->field_0)._impl_.json_format_ - 3U < 0xfffffffe) {
      args = "Feature field `json_format` must resolve to a known value, found JSON_FORMAT_UNKNOWN";
    }
    else if ((features->field_0)._impl_.enforce_naming_style_ - 3U < 0xfffffffe) {
      args = 
      "Feature field `enforce_naming_style` must resolve to a known value, found ENFORCE_NAMING_STYLE_UNKNOWN"
      ;
    }
    else {
      if (0xfffffffb < (features->field_0)._impl_.default_symbol_visibility_ - 5U) {
        *(undefined8 *)this = 1;
        return (Status)(uintptr_t)this;
      }
      args = 
      "Feature field `default_symbol_visibility` must resolve to a known value, found VisibilityFeature::DEFAULT_SYMBOL_VISIBILITY_UNKNOWN"
      ;
    }
  }
  protobuf::(anonymous_namespace)::Error<char_const*>((_anonymous_namespace_ *)this,args);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ValidateMergedFeatures(const FeatureSet& features) {
// Avoid using reflection here because this is called early in the descriptor
// builds.  Instead, a reflection-based test will be used to keep this in sync
// with descriptor.proto.  These checks should be run on every global feature
// in FeatureSet.
#define CHECK_ENUM_FEATURE(FIELD, CAMELCASE, UPPERCASE)               \
  if (!FeatureSet::CAMELCASE##_IsValid(features.FIELD()) ||           \
      features.FIELD() == FeatureSet::UPPERCASE##_UNKNOWN) {          \
    return Error("Feature field `" #FIELD                             \
                 "` must resolve to a known value, found " #UPPERCASE \
                 "_UNKNOWN");                                         \
  }

  CHECK_ENUM_FEATURE(field_presence, FieldPresence, FIELD_PRESENCE)
  CHECK_ENUM_FEATURE(enum_type, EnumType, ENUM_TYPE)
  CHECK_ENUM_FEATURE(repeated_field_encoding, RepeatedFieldEncoding,
                     REPEATED_FIELD_ENCODING)
  CHECK_ENUM_FEATURE(utf8_validation, Utf8Validation, UTF8_VALIDATION)
  CHECK_ENUM_FEATURE(message_encoding, MessageEncoding, MESSAGE_ENCODING)
  CHECK_ENUM_FEATURE(json_format, JsonFormat, JSON_FORMAT)
  CHECK_ENUM_FEATURE(enforce_naming_style, EnforceNamingStyle,
                     ENFORCE_NAMING_STYLE)
  CHECK_ENUM_FEATURE(default_symbol_visibility,
                     VisibilityFeature::DefaultSymbolVisibility,
                     VisibilityFeature::DEFAULT_SYMBOL_VISIBILITY)

#undef CHECK_ENUM_FEATURE

  return absl::OkStatus();
}